

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZTensor<double>,_3>::TPZManVector
          (TPZManVector<TPZTensor<double>,_3> *this,TPZManVector<TPZTensor<double>,_3> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  TPZTensor<double> *pTVar5;
  long lVar6;
  ulong uVar7;
  
  (this->super_TPZVec<TPZTensor<double>_>).fStore = (TPZTensor<double> *)0x0;
  (this->super_TPZVec<TPZTensor<double>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<double>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f3c8;
  pTVar5 = this->fExtAlloc;
  lVar6 = 0;
  do {
    *(undefined ***)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + -0x28) =
         &PTR__TPZTensor_0189f0b0;
    TPZVec<double>::TPZVec
              ((TPZVec<double> *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + -0x20),0);
    *(undefined ***)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + -0x20) =
         &PTR__TPZManVector_0189f470;
    *(long *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + -0x18) =
         (long)this->fExtAlloc[0].fData.fExtAlloc + lVar6;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + -0x10) = 6;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + -8) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + 8) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + 0x10) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + 0x18) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + 0x20) = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].fData.fExtAlloc + lVar6 + 0x28) = 0;
    lVar6 = lVar6 + 0x58;
  } while (lVar6 != 0x108);
  uVar7 = (copy->super_TPZVec<TPZTensor<double>_>).fNElements;
  if ((long)uVar7 < 4) {
    uVar2 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    uVar2 = SUB168(auVar1 * ZEXT816(0x58),0);
    uVar4 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar4 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x58),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar3 = (ulong *)operator_new__(uVar4);
    *puVar3 = uVar7;
    pTVar5 = (TPZTensor<double> *)(puVar3 + 1);
    lVar6 = 0;
    do {
      puVar3[1] = (ulong)&PTR__TPZTensor_0189f0b0;
      TPZVec<double>::TPZVec((TPZVec<double> *)(puVar3 + 2),0);
      puVar3[2] = (ulong)&PTR__TPZManVector_0189f470;
      puVar3[3] = (ulong)(puVar3 + 6);
      puVar3[4] = 6;
      puVar3[5] = 0;
      puVar3[6] = 0;
      puVar3[7] = 0;
      puVar3[8] = 0;
      puVar3[9] = 0;
      puVar3[10] = 0;
      puVar3[0xb] = 0;
      lVar6 = lVar6 + -0x58;
      puVar3 = puVar3 + 0xb;
      uVar2 = uVar7;
    } while (uVar7 * -0x58 != lVar6);
  }
  (this->super_TPZVec<TPZTensor<double>_>).fStore = pTVar5;
  (this->super_TPZVec<TPZTensor<double>_>).fNElements = uVar7;
  (this->super_TPZVec<TPZTensor<double>_>).fNAlloc = uVar2;
  if (0 < (long)uVar7) {
    lVar6 = 8;
    do {
      TPZManVector<double,_6>::operator=
                ((TPZManVector<double,_6> *)
                 ((long)(((this->super_TPZVec<TPZTensor<double>_>).fStore)->fData).fExtAlloc +
                 lVar6 + -0x28),
                 (TPZManVector<double,_6> *)
                 ((long)(((copy->super_TPZVec<TPZTensor<double>_>).fStore)->fData).fExtAlloc +
                 lVar6 + -0x28));
      lVar6 = lVar6 + 0x58;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}